

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

char * skip(char **buf,char *delimiters)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  __s_00 = *buf;
  sVar1 = strcspn(__s_00,delimiters);
  __s = __s_00 + sVar1;
  sVar2 = strspn(__s,delimiters);
  if (0 < (long)sVar2) {
    pcVar3 = __s_00 + sVar1 + 1;
    if (__s_00 + sVar1 + 1 < __s + sVar2) {
      pcVar3 = __s + sVar2;
    }
    memset(__s,0,(long)pcVar3 - (long)__s);
  }
  *buf = __s + sVar2;
  return __s_00;
}

Assistant:

static char *skip(char **buf, const char *delimiters) {
  char *p, *begin_word, *end_word, *end_delimiters;

  begin_word = *buf;
  end_word = begin_word + strcspn(begin_word, delimiters);
  end_delimiters = end_word + strspn(end_word, delimiters);

  for (p = end_word; p < end_delimiters; p++) {
    *p = '\0';
  }

  *buf = end_delimiters;

  return begin_word;
}